

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_log(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  CHAR_DATA *ch_00;
  char *txt;
  char arg [4608];
  char local_1218 [4616];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    txt = "Log whom?\n\r";
  }
  else {
    bVar2 = str_cmp(local_1218,"all");
    if (bVar2) {
      ch_00 = get_char_world(ch,local_1218);
      if (ch_00 == (CHAR_DATA *)0x0) {
        txt = "They aren\'t here.\n\r";
      }
      else {
        bVar2 = is_npc(ch_00);
        if (bVar2) {
          txt = "Not on NPC\'s.\n\r";
        }
        else {
          uVar1 = ch_00->act[0];
          if (((uint)uVar1 >> 0x16 & 1) == 0) {
            ch_00->act[0] = uVar1 | 0x400000;
            txt = "LOG set.\n\r";
          }
          else {
            ch_00->act[0] = uVar1 & 0xffffffffffbfffff;
            txt = "LOG removed.\n\r";
          }
        }
      }
    }
    else if (fLogAll == true) {
      fLogAll = false;
      txt = "Log ALL off.\n\r";
    }
    else {
      fLogAll = true;
      txt = "Log ALL on.\n\r";
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_log(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Log whom?\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "all"))
	{
		if (fLogAll)
		{
			fLogAll = false;
			send_to_char("Log ALL off.\n\r", ch);
		}
		else
		{
			fLogAll = true;
			send_to_char("Log ALL on.\n\r", ch);
		}

		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	/*
	 * No level check, gods can log anyone.
	 */
	if (IS_SET(victim->act, PLR_LOG))
	{
		REMOVE_BIT(victim->act, PLR_LOG);
		send_to_char("LOG removed.\n\r", ch);
	}
	else
	{
		SET_BIT(victim->act, PLR_LOG);
		send_to_char("LOG set.\n\r", ch);
	}
}